

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O3

void pnga_sprs_array_shift_diag(Integer s_a,void *shift)

{
  int *piVar1;
  long *plVar2;
  float fVar3;
  double dVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  int iVar8;
  Integer grp;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  double dVar12;
  int *_vptr;
  Integer iproc;
  long lVar13;
  long lVar14;
  undefined1 (*pauVar15) [16];
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long icol;
  long lVar20;
  bool bVar21;
  int64_t *jlptr;
  int64_t *ilptr;
  int *jptr;
  int *iptr;
  void *vptr;
  Integer ihi;
  Integer ilo;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  Integer local_70;
  long local_68;
  int local_5c;
  Integer local_58;
  Integer local_50;
  ulong local_48;
  long local_40;
  long local_38;
  
  grp = SPA[s_a + 1000].grp;
  local_70 = s_a;
  iproc = pnga_pgroup_nodeid(grp);
  local_58 = pnga_pgroup_nnodes(grp);
  lVar20 = SPA[s_a + 1000].type;
  local_48 = (ulong)(uint)SPA[s_a + 1000].idx_size;
  bVar21 = _ga_sync_begin != 0;
  local_5c = _ga_sync_end;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (bVar21) {
    pnga_pgroup_sync(grp);
  }
  local_50 = grp;
  pnga_sprs_array_row_distribution(local_70,iproc,&local_38,&local_40);
  if (0 < local_58) {
    icol = 0;
    lVar20 = lVar20 + -0x3e9;
    do {
      if ((int)local_48 == 4) {
        pnga_sprs_array_access_col_block(local_70,icol,&local_78,&local_80,&local_68);
        if (local_68 != 0) {
          switch(lVar20) {
          case 0:
            if (local_38 <= local_40) {
              iVar7 = *shift;
              lVar13 = local_38;
              do {
                lVar14 = (long)*(int *)(local_78 + ((lVar13 + 1) - local_38) * 4) -
                         (long)*(int *)(local_78 + (lVar13 - local_38) * 4);
                if (0 < (int)lVar14) {
                  lVar16 = 0;
                  do {
                    lVar18 = *(int *)(local_78 + (lVar13 - local_38) * 4) + lVar16;
                    if (lVar13 == *(int *)(local_80 + lVar18 * 4)) {
                      piVar1 = (int *)(local_68 + lVar18 * 4);
                      *piVar1 = *piVar1 + iVar7;
                    }
                    lVar16 = lVar16 + 1;
                  } while (lVar14 != lVar16);
                }
                bVar21 = lVar13 != local_40;
                lVar13 = lVar13 + 1;
              } while (bVar21);
            }
            break;
          case 1:
            if (local_38 <= local_40) {
              lVar13 = *shift;
              lVar14 = local_38;
              do {
                iVar7 = *(int *)(local_78 + ((lVar14 + 1) - local_38) * 4);
                iVar8 = *(int *)(local_78 + (lVar14 - local_38) * 4);
                lVar16 = (long)iVar8;
                if (iVar8 < iVar7) {
                  do {
                    if (lVar14 == *(int *)(local_80 + lVar16 * 4)) {
                      plVar2 = (long *)(local_68 + lVar16 * 8);
                      *plVar2 = *plVar2 + lVar13;
                    }
                    lVar16 = lVar16 + 1;
                  } while (iVar7 != lVar16);
                }
                bVar21 = lVar14 != local_40;
                lVar14 = lVar14 + 1;
              } while (bVar21);
            }
            break;
          case 2:
            if (local_38 <= local_40) {
              fVar3 = *shift;
              lVar13 = local_38;
              do {
                iVar7 = *(int *)(local_78 + ((lVar13 + 1) - local_38) * 4);
                iVar8 = *(int *)(local_78 + (lVar13 - local_38) * 4);
                lVar14 = (long)iVar8;
                if (iVar8 < iVar7) {
                  do {
                    if (lVar13 == *(int *)(local_80 + lVar14 * 4)) {
                      *(float *)(local_68 + lVar14 * 4) = *(float *)(local_68 + lVar14 * 4) + fVar3;
                    }
                    lVar14 = lVar14 + 1;
                  } while (iVar7 != lVar14);
                }
                bVar21 = lVar13 != local_40;
                lVar13 = lVar13 + 1;
              } while (bVar21);
            }
            break;
          case 3:
            if (local_38 <= local_40) {
              dVar4 = *shift;
              lVar13 = local_38;
              do {
                iVar7 = *(int *)(local_78 + ((lVar13 + 1) - local_38) * 4);
                iVar8 = *(int *)(local_78 + (lVar13 - local_38) * 4);
                lVar14 = (long)iVar8;
                if (iVar8 < iVar7) {
                  do {
                    if (lVar13 == *(int *)(local_80 + lVar14 * 4)) {
                      *(double *)(local_68 + lVar14 * 8) =
                           *(double *)(local_68 + lVar14 * 8) + dVar4;
                    }
                    lVar14 = lVar14 + 1;
                  } while (iVar7 != lVar14);
                }
                bVar21 = lVar13 != local_40;
                lVar13 = lVar13 + 1;
              } while (bVar21);
            }
            break;
          case 5:
            if (local_38 <= local_40) {
              uVar5 = *shift;
              lVar13 = local_38;
              do {
                iVar7 = *(int *)(local_78 + ((lVar13 + 1) - local_38) * 4);
                iVar8 = *(int *)(local_78 + (lVar13 - local_38) * 4);
                lVar14 = (long)iVar8;
                if (iVar8 < iVar7) {
                  do {
                    if (lVar13 == *(int *)(local_80 + lVar14 * 4)) {
                      uVar6 = *(undefined8 *)(local_68 + lVar14 * 8);
                      *(ulong *)(local_68 + lVar14 * 8) =
                           CONCAT44((float)((ulong)uVar6 >> 0x20) + (float)((ulong)uVar5 >> 0x20),
                                    (float)uVar6 + (float)uVar5);
                    }
                    lVar14 = lVar14 + 1;
                  } while (iVar7 != lVar14);
                }
                bVar21 = lVar13 != local_40;
                lVar13 = lVar13 + 1;
              } while (bVar21);
            }
            break;
          case 6:
            if (local_38 <= local_40) {
              dVar4 = *shift;
              dVar12 = *(double *)((long)shift + 8);
              lVar13 = local_38;
              do {
                iVar7 = *(int *)(local_78 + ((lVar13 + 1) - local_38) * 4);
                iVar8 = *(int *)(local_78 + (lVar13 - local_38) * 4);
                lVar14 = (long)iVar8;
                if (iVar8 < iVar7) {
                  pauVar15 = (undefined1 (*) [16])(lVar14 * 0x10 + local_68);
                  do {
                    if (lVar13 == *(int *)(local_80 + lVar14 * 4)) {
                      dVar11 = *(double *)(*pauVar15 + 8) + dVar12;
                      auVar9._8_4_ = SUB84(dVar11,0);
                      auVar9._0_8_ = *(double *)*pauVar15 + dVar4;
                      auVar9._12_4_ = (int)((ulong)dVar11 >> 0x20);
                      *pauVar15 = auVar9;
                    }
                    lVar14 = lVar14 + 1;
                    pauVar15 = pauVar15 + 1;
                  } while (iVar7 != lVar14);
                }
                bVar21 = lVar13 != local_40;
                lVar13 = lVar13 + 1;
              } while (bVar21);
            }
            break;
          case 0xf:
            if (local_38 <= local_40) {
              lVar13 = *shift;
              lVar14 = local_38;
              do {
                iVar7 = *(int *)(local_78 + ((lVar14 + 1) - local_38) * 4);
                iVar8 = *(int *)(local_78 + (lVar14 - local_38) * 4);
                lVar16 = (long)iVar8;
                if (iVar8 < iVar7) {
                  do {
                    if (lVar14 == *(int *)(local_80 + lVar16 * 4)) {
                      plVar2 = (long *)(local_68 + lVar16 * 8);
                      *plVar2 = *plVar2 + lVar13;
                    }
                    lVar16 = lVar16 + 1;
                  } while (iVar7 != lVar16);
                }
                bVar21 = lVar14 != local_40;
                lVar14 = lVar14 + 1;
              } while (bVar21);
            }
          }
        }
      }
      else {
        pnga_sprs_array_access_col_block(local_70,icol,&local_88,&local_90,&local_68);
        if (local_68 != 0) {
          switch(lVar20) {
          case 0:
            if (local_38 <= local_40) {
              iVar7 = *shift;
              lVar13 = local_38;
              do {
                lVar14 = *(long *)(local_88 + ((lVar13 + 1) - local_38) * 8);
                lVar16 = *(long *)(local_88 + (lVar13 - local_38) * 8);
                if (lVar16 < lVar14) {
                  do {
                    if (lVar13 == *(long *)(local_90 + lVar16 * 8)) {
                      piVar1 = (int *)(local_68 + lVar16 * 4);
                      *piVar1 = *piVar1 + iVar7;
                    }
                    lVar16 = lVar16 + 1;
                  } while (lVar14 != lVar16);
                }
                bVar21 = lVar13 != local_40;
                lVar13 = lVar13 + 1;
              } while (bVar21);
            }
            break;
          case 1:
            if (local_38 <= local_40) {
              lVar13 = *shift;
              lVar14 = local_38;
              do {
                lVar16 = *(long *)(local_88 + ((lVar14 + 1) - local_38) * 8);
                lVar18 = *(long *)(local_88 + (lVar14 - local_38) * 8);
                if (lVar18 < lVar16) {
                  lVar17 = 0;
                  do {
                    lVar19 = *(long *)(local_88 + (lVar14 - local_38) * 8) + lVar17;
                    if (lVar14 == *(long *)(local_90 + lVar19 * 8)) {
                      plVar2 = (long *)(local_68 + lVar19 * 8);
                      *plVar2 = *plVar2 + lVar13;
                    }
                    lVar17 = lVar17 + 1;
                  } while (lVar16 - lVar18 != lVar17);
                }
                bVar21 = lVar14 != local_40;
                lVar14 = lVar14 + 1;
              } while (bVar21);
            }
            break;
          case 2:
            if (local_38 <= local_40) {
              fVar3 = *shift;
              lVar13 = local_38;
              do {
                lVar14 = *(long *)(local_88 + ((lVar13 + 1) - local_38) * 8);
                lVar16 = *(long *)(local_88 + (lVar13 - local_38) * 8);
                if (lVar16 < lVar14) {
                  do {
                    if (lVar13 == *(long *)(local_90 + lVar16 * 8)) {
                      *(float *)(local_68 + lVar16 * 4) = *(float *)(local_68 + lVar16 * 4) + fVar3;
                    }
                    lVar16 = lVar16 + 1;
                  } while (lVar14 != lVar16);
                }
                bVar21 = lVar13 != local_40;
                lVar13 = lVar13 + 1;
              } while (bVar21);
            }
            break;
          case 3:
            if (local_38 <= local_40) {
              dVar4 = *shift;
              lVar13 = local_38;
              do {
                lVar14 = *(long *)(local_88 + ((lVar13 + 1) - local_38) * 8);
                lVar16 = *(long *)(local_88 + (lVar13 - local_38) * 8);
                if (lVar16 < lVar14) {
                  do {
                    if (lVar13 == *(long *)(local_90 + lVar16 * 8)) {
                      *(double *)(local_68 + lVar16 * 8) =
                           *(double *)(local_68 + lVar16 * 8) + dVar4;
                    }
                    lVar16 = lVar16 + 1;
                  } while (lVar14 != lVar16);
                }
                bVar21 = lVar13 != local_40;
                lVar13 = lVar13 + 1;
              } while (bVar21);
            }
            break;
          case 5:
            if (local_38 <= local_40) {
              uVar5 = *shift;
              lVar13 = local_38;
              do {
                lVar14 = *(long *)(local_88 + ((lVar13 + 1) - local_38) * 8);
                lVar16 = *(long *)(local_88 + (lVar13 - local_38) * 8);
                if (lVar16 < lVar14) {
                  do {
                    if (lVar13 == *(long *)(local_90 + lVar16 * 8)) {
                      uVar6 = *(undefined8 *)(local_68 + lVar16 * 8);
                      *(ulong *)(local_68 + lVar16 * 8) =
                           CONCAT44((float)((ulong)uVar6 >> 0x20) + (float)((ulong)uVar5 >> 0x20),
                                    (float)uVar6 + (float)uVar5);
                    }
                    lVar16 = lVar16 + 1;
                  } while (lVar14 != lVar16);
                }
                bVar21 = lVar13 != local_40;
                lVar13 = lVar13 + 1;
              } while (bVar21);
            }
            break;
          case 6:
            if (local_38 <= local_40) {
              dVar4 = *shift;
              dVar12 = *(double *)((long)shift + 8);
              lVar13 = local_38;
              do {
                lVar14 = *(long *)(local_88 + ((lVar13 + 1) - local_38) * 8);
                lVar16 = *(long *)(local_88 + (lVar13 - local_38) * 8);
                if (lVar16 < lVar14) {
                  pauVar15 = (undefined1 (*) [16])(lVar16 * 0x10 + local_68);
                  do {
                    if (lVar13 == *(long *)(local_90 + lVar16 * 8)) {
                      dVar11 = *(double *)(*pauVar15 + 8) + dVar12;
                      auVar10._8_4_ = SUB84(dVar11,0);
                      auVar10._0_8_ = *(double *)*pauVar15 + dVar4;
                      auVar10._12_4_ = (int)((ulong)dVar11 >> 0x20);
                      *pauVar15 = auVar10;
                    }
                    lVar16 = lVar16 + 1;
                    pauVar15 = pauVar15 + 1;
                  } while (lVar14 != lVar16);
                }
                bVar21 = lVar13 != local_40;
                lVar13 = lVar13 + 1;
              } while (bVar21);
            }
            break;
          case 0xf:
            if (local_38 <= local_40) {
              lVar13 = *shift;
              lVar14 = local_38;
              do {
                lVar16 = *(long *)(local_88 + ((lVar14 + 1) - local_38) * 8);
                lVar18 = *(long *)(local_88 + (lVar14 - local_38) * 8);
                if (lVar18 < lVar16) {
                  do {
                    if (lVar14 == *(long *)(local_90 + lVar18 * 8)) {
                      plVar2 = (long *)(local_68 + lVar18 * 8);
                      *plVar2 = *plVar2 + lVar13;
                    }
                    lVar18 = lVar18 + 1;
                  } while (lVar16 != lVar18);
                }
                bVar21 = lVar14 != local_40;
                lVar14 = lVar14 + 1;
              } while (bVar21);
            }
          }
        }
      }
      icol = icol + 1;
    } while (icol != local_58);
  }
  if (local_5c != 0) {
    pnga_pgroup_sync(local_50);
    return;
  }
  return;
}

Assistant:

void pnga_sprs_array_shift_diag(Integer s_a, void *shift)
{
  Integer hdl = GA_OFFSET + s_a;
  int local_sync_begin,local_sync_end;
  Integer grp = SPA[hdl].grp;
  Integer me = pnga_pgroup_nodeid(grp);
  Integer nproc = pnga_pgroup_nnodes(grp);
  Integer ilo, ihi;
  Integer i, j, iproc, ncols;
  Integer type = SPA[hdl].type;
  int idx_size = SPA[hdl].idx_size;
  int *iptr, *jptr;
  int64_t *ilptr, *jlptr;
  void *vptr;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if (local_sync_begin) pnga_pgroup_sync(grp);

  /* get block from diagonal array corresponding to this row block (there is
   * only one) */
  pnga_sprs_array_row_distribution(s_a,me,&ilo,&ihi);

#define SPRS_REAL_SHIFT_DIAG_M(_type,_iptr,_jptr)             \
  {                                                           \
    _type _shift = *((_type*)shift);                          \
    _type *_vptr = (_type*)vptr;                              \
    for (i=ilo; i<=ihi; i++) {                                \
      ncols = _iptr[i+1-ilo]-_iptr[i-ilo];                    \
      for (j=0; j<ncols; j++) {                               \
        if (i == _jptr[_iptr[i-ilo]+j]) {                     \
          _vptr[_iptr[i-ilo]+j] += _shift;                    \
        }                                                     \
      }                                                       \
    }                                                         \
  }                

#define SPRS_COMPLEX_SHIFT_DIAG_M(_type,_iptr,_jptr)          \
  {                                                           \
    _type _rshift = ((_type*)shift)[0];                       \
    _type _ishift = ((_type*)shift)[1];                       \
    _type *_vptr = (_type*)vptr;                              \
    for (i=ilo; i<=ihi; i++) {                                \
      ncols = _iptr[i+1-ilo]-_iptr[i-ilo];                    \
      for (j=0; j<ncols; j++) {                               \
        if (i == _jptr[_iptr[i-ilo]+j]) {                     \
          _vptr[2*(_iptr[i-ilo]+j)] += _rshift;               \
          _vptr[2*(_iptr[i-ilo]+j)+1] += _ishift;             \
        }                                                     \
      }                                                       \
    }                                                         \
  }                

  /* loop over blocks in sparse array */
  for (iproc=0; iproc<nproc; iproc++) {
    if (idx_size == 4) {
      pnga_sprs_array_access_col_block(s_a,iproc,&iptr,&jptr,&vptr);
      if (vptr != NULL) {
        if (type == C_INT) {
          SPRS_REAL_SHIFT_DIAG_M(int,iptr,jptr);
        } else if (type == C_LONG) {
          SPRS_REAL_SHIFT_DIAG_M(long,iptr,jptr);
        } else if (type == C_LONGLONG) {
          SPRS_REAL_SHIFT_DIAG_M(long long,iptr,jptr);
        } else if (type == C_FLOAT) {
          SPRS_REAL_SHIFT_DIAG_M(float,iptr,jptr);
        } else if (type == C_DBL) {
          SPRS_REAL_SHIFT_DIAG_M(double,iptr,jptr);
        } else if (type == C_SCPL) {
          SPRS_COMPLEX_SHIFT_DIAG_M(float,iptr,jptr);
        } else if (type == C_DCPL) {
          SPRS_COMPLEX_SHIFT_DIAG_M(double,iptr,jptr);
        }
      }
    } else {
      pnga_sprs_array_access_col_block(s_a,iproc,&ilptr,&jlptr,&vptr);
      if (vptr != NULL) {
        if (type == C_INT) {
          SPRS_REAL_SHIFT_DIAG_M(int,ilptr,jlptr);
        } else if (type == C_LONG) {
          SPRS_REAL_SHIFT_DIAG_M(long,ilptr,jlptr);
        } else if (type == C_LONGLONG) {
          SPRS_REAL_SHIFT_DIAG_M(long long,ilptr,jlptr);
        } else if (type == C_FLOAT) {
          SPRS_REAL_SHIFT_DIAG_M(float,ilptr,jlptr);
        } else if (type == C_DBL) {
          SPRS_REAL_SHIFT_DIAG_M(double,ilptr,jlptr);
        } else if (type == C_SCPL) {
          SPRS_COMPLEX_SHIFT_DIAG_M(float,ilptr,jlptr);
        } else if (type == C_DCPL) {
          SPRS_COMPLEX_SHIFT_DIAG_M(double,ilptr,jlptr);
        }
      }
    }
  }

#undef SPRS_REAL_SHIFT_DIAG_M
#undef SPRS_COMPLEX_SHIFT_DIAG_M

  if (local_sync_end) pnga_pgroup_sync(grp);
}